

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

void Assimp::BaseImporter::ConvertUTF8toISO8859_1(string *data)

{
  ulong uVar1;
  pointer pcVar2;
  ostream *poVar3;
  Logger *pLVar4;
  char cVar5;
  ulong uVar6;
  long lVar8;
  long lVar9;
  ulong uVar10;
  stringstream stream;
  char local_1e0;
  undefined7 uStack_1df;
  undefined1 local_1d0 [16];
  ulong local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  ulong uVar7;
  
  uVar1 = data->_M_string_length;
  if (uVar1 == 0) {
    lVar9 = 0;
  }
  else {
    uVar10 = uVar1 - 1;
    lVar9 = 0;
    uVar6 = 0;
    local_1c0 = uVar10;
    do {
      pcVar2 = (data->_M_dataplus)._M_p;
      cVar5 = pcVar2[uVar6];
      uVar7 = uVar6;
      if (cVar5 < '\0') {
        if (uVar10 <= uVar6) {
          pLVar4 = DefaultLogger::get();
          Logger::error(pLVar4,"UTF8 code but only one character remaining");
          pcVar2 = (data->_M_dataplus)._M_p;
          cVar5 = pcVar2[uVar6];
          goto LAB_0039d917;
        }
        if (cVar5 == -0x3d) {
          cVar5 = pcVar2[uVar6 + 1] + '@';
          uVar7 = uVar6 + 1;
          goto LAB_0039d917;
        }
        if (cVar5 == -0x3e) {
          cVar5 = pcVar2[uVar6 + 1];
          uVar7 = uVar6 + 1;
          goto LAB_0039d917;
        }
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"UTF8 code ",10);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        local_1e0 = (data->_M_dataplus)._M_p[uVar6];
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,&local_1e0,1);
        local_1e0 = (data->_M_dataplus)._M_p[uVar6 + 1];
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_1e0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3," can not be converted into ISA-8859-1.",0x26);
        pLVar4 = DefaultLogger::get();
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar4,(char *)CONCAT71(uStack_1df,local_1e0));
        if ((undefined1 *)CONCAT71(uStack_1df,local_1e0) != local_1d0) {
          operator_delete((undefined1 *)CONCAT71(uStack_1df,local_1e0));
        }
        uVar7 = uVar6 + 1;
        pcVar2 = (data->_M_dataplus)._M_p;
        lVar8 = lVar9 + 1;
        pcVar2[lVar9] = pcVar2[uVar6];
        pcVar2 = (data->_M_dataplus)._M_p;
        pcVar2[lVar9 + 1] = pcVar2[uVar6 + 1];
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        uVar10 = local_1c0;
      }
      else {
LAB_0039d917:
        pcVar2[lVar9] = cVar5;
        lVar8 = lVar9;
      }
      uVar6 = uVar7 + 1;
      lVar9 = lVar8 + 1;
    } while (uVar6 < uVar1);
  }
  std::__cxx11::string::resize((ulong)data,(char)lVar9);
  return;
}

Assistant:

void BaseImporter::ConvertUTF8toISO8859_1(std::string& data)
{
    size_t size = data.size();
    size_t i = 0, j = 0;

    while(i < size) {
        if ((unsigned char) data[i] < (size_t) 0x80) {
            data[j] = data[i];
        } else if(i < size - 1) {
            if((unsigned char) data[i] == 0xC2) {
                data[j] = data[++i];
            } else if((unsigned char) data[i] == 0xC3) {
                data[j] = ((unsigned char) data[++i] + 0x40);
            } else {
                std::stringstream stream;
                stream << "UTF8 code " << std::hex << data[i] << data[i + 1] << " can not be converted into ISA-8859-1.";
                ASSIMP_LOG_ERROR( stream.str() );

                data[j++] = data[i++];
                data[j] = data[i];
            }
        } else {
            ASSIMP_LOG_ERROR("UTF8 code but only one character remaining");

            data[j] = data[i];
        }

        i++; j++;
    }

    data.resize(j);
}